

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_scriptedmarine.cpp
# Opt level: O0

int AF_A_M_Refire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *this;
  DObject *this_00;
  bool bVar1;
  int iVar2;
  AActor *pAVar3;
  bool bVar4;
  bool local_57;
  bool local_54;
  bool ignoremissile;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar4 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar4 = true, (param->field_0).field_1.atag != 1)) {
    bVar4 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar4) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this = *(AActor **)&param->field_0;
  local_54 = true;
  if (this != (AActor *)0x0) {
    local_54 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
  }
  if (local_54 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                  ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((param[1].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[1].field_0.field_1.atag != 1)) {
      bVar4 = param[1].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_57 = true;
    if (this_00 != (DObject *)0x0) {
      local_57 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_57 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
    bVar4 = false;
    if ((param[2].field_0.field_3.Type == '\x03') &&
       (bVar4 = true, param[2].field_0.field_1.atag != 8)) {
      bVar4 = param[2].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar4) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x9e,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  if ((numparam < 4) || (param[3].field_0.field_3.Type == 0xff)) {
    bVar4 = false;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      __assert_fail("param[paramnum].Type == REGT_INT",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_scriptedmarine.cpp"
                    ,0x9f,"int AF_A_M_Refire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    bVar4 = param[3].field_0.i != 0;
  }
  bVar1 = TObjPtr<AActor>::operator==(&this->target,(AActor *)0x0);
  if ((bVar1) || (pAVar3 = TObjPtr<AActor>::operator->(&this->target), pAVar3->health < 1)) {
    if ((this->MissileState == (FState *)0x0) ||
       (((iVar2 = FRandom::operator()(&pr_m_refire), 0x9f < iVar2 ||
         (bVar4 = P_LookForPlayers(this,1,(FLookExParams *)0x0), !bVar4)) ||
        (bVar4 = P_CheckMissileRange(this), !bVar4)))) {
      AActor::SetState(this,this->state + 1,false);
    }
  }
  else {
    if (((!bVar4) && (this->MissileState != (FState *)0x0)) ||
       (bVar4 = AActor::CheckMeleeRange(this), bVar4)) {
      pAVar3 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&this->target);
      bVar4 = P_CheckSight(this,pAVar3,0);
      if ((bVar4) && (iVar2 = FRandom::operator()(&pr_m_refire), 3 < iVar2)) {
        return 0;
      }
    }
    AActor::SetState(this,this->state + 1,false);
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_M_Refire)
{
	PARAM_ACTION_PROLOGUE;
	PARAM_BOOL_OPT(ignoremissile)	{ ignoremissile = false; }

	if (self->target == NULL || self->target->health <= 0)
	{
		if (self->MissileState && pr_m_refire() < 160)
		{ // Look for a new target most of the time
			if (P_LookForPlayers (self, true, NULL) && P_CheckMissileRange (self))
			{ // Found somebody new and in range, so don't stop shooting
				return 0;
			}
		}
		self->SetState (self->state + 1);
		return 0;
	}
	if (((ignoremissile || self->MissileState == NULL) && !self->CheckMeleeRange ()) ||
		!P_CheckSight (self, self->target) ||
		pr_m_refire() < 4)	// Small chance of stopping even when target not dead
	{
		self->SetState (self->state + 1);
	}
	return 0;
}